

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainNN.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *__nptr;
  double *pdVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar9;
  undefined8 uVar10;
  NaException *ex;
  int nSamples_1;
  int nSamples;
  int j;
  int iLayer;
  int iEpoch;
  NaReal *pTeMSE;
  NaReal *pLeMSE;
  NaReal *pOut;
  NaReal *pTar;
  NaReal *pIn;
  char *szQPropMu;
  NaStdBackProp *nnteacher;
  NaQuickProp qpe;
  NaStdBackProp bpe;
  NaNNUnit nn;
  NaDataFile *dfTeOut;
  NaDataFile *dfTeIn;
  NaDataFile *dfLeOut;
  NaDataFile *dfLeIn;
  char *szMaxEpochs;
  int nMaxEpochs;
  byte local_169a;
  byte local_167a;
  NaStdBackProp *local_1620;
  int local_15ec;
  int local_15e8;
  uint local_15e4;
  int local_15e0;
  uint local_15dc;
  NaStdBackProp *local_15a8;
  long local_15a0;
  double adStack_1598 [263];
  NaStdBackProp local_d60 [1824];
  NaNNUnit local_640 [64];
  NaNeuralNetDescr local_600 [100];
  uint local_59c;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_28;
  char *local_20;
  int local_14;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 4) {
    printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",*in_RSI);
    local_4 = 1;
  }
  else {
    local_10 = in_RSI;
    local_8 = in_EDI;
    NaOpenLogFile("TrainNN.log");
    signal(2,handle_sigint);
    local_14 = -1;
    local_20 = getenv("MAX_EPOCHS");
    if (local_20 != (char *)0x0) {
      local_14 = atoi(local_20);
    }
    local_28 = (long *)OpenInputDataFile((char *)local_10[2]);
    local_50 = (long *)OpenInputDataFile((char *)local_10[3]);
    local_48 = local_28;
    local_40 = local_50;
    if ((4 < local_8) && (iVar2 = strcmp((char *)local_10[4],"-"), iVar2 != 0)) {
      local_48 = (long *)OpenInputDataFile((char *)local_10[4]);
    }
    if ((5 < local_8) && (iVar2 = strcmp((char *)local_10[5],"-"), iVar2 != 0)) {
      local_50 = (long *)OpenInputDataFile((char *)local_10[5]);
    }
    NaNNUnit::NaNNUnit(local_640);
    NaNNUnit::Load((char *)local_640);
    NaStdBackProp::NaStdBackProp(local_d60,local_640);
    NaQuickProp::NaQuickProp((NaQuickProp *)&local_15a0,local_640);
    local_15a8 = local_d60;
    __nptr = getenv("QPROP_MU");
    if (__nptr != (char *)0x0) {
      dVar9 = atof(__nptr);
      *(double *)((long)adStack_1598 + *(long *)(local_15a0 + -0x18)) = dVar9;
      local_1620 = (NaStdBackProp *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x15a0) {
        local_1620 = (NaStdBackProp *)((long)adStack_1598 + *(long *)(local_15a0 + -0x28) + -8);
      }
      local_15a8 = local_1620;
    }
    uVar3 = NaNeuralNetDescr::InputsNumber(local_600);
    pdVar4 = (double *)operator_new__((ulong)uVar3 << 3);
    pvVar5 = operator_new__((ulong)local_59c << 3);
    pvVar6 = operator_new__((ulong)local_59c << 3);
    pvVar7 = operator_new__((ulong)local_59c << 3);
    pvVar8 = operator_new__((ulong)local_59c << 3);
    local_15dc = 0;
    while (((bTerminate ^ 0xffU) & 1) != 0) {
      local_15dc = local_15dc + 1;
      for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
        *(undefined8 *)((long)pvVar8 + (long)(int)local_15e4 * 8) = 0;
        *(undefined8 *)((long)pvVar7 + (long)(int)local_15e4 * 8) = 0;
      }
      bVar1 = (**(code **)(*local_28 + 0x28))();
      if (((bVar1 & 1) != 0) && (bVar1 = (**(code **)(*local_40 + 0x28))(), (bVar1 & 1) != 0)) {
        local_15e8 = 0;
        do {
          for (local_15e4 = 0; uVar3 = NaNeuralNetDescr::InputsNumber(local_600), local_15e4 < uVar3
              ; local_15e4 = local_15e4 + 1) {
            dVar9 = (double)(**(code **)(*local_28 + 0x18))(local_28,local_15e4);
            pdVar4[(int)local_15e4] = dVar9;
          }
          for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
            uVar10 = (**(code **)(*local_40 + 0x18))(local_40,local_15e4);
            *(undefined8 *)((long)pvVar5 + (long)(int)local_15e4 * 8) = uVar10;
          }
          NaNNUnit::Function((double *)local_640,pdVar4);
          for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
            *(double *)((long)pvVar7 + (long)(int)local_15e4 * 8) =
                 (*(double *)((long)pvVar5 + (long)(int)local_15e4 * 8) -
                 *(double *)((long)pvVar6 + (long)(int)local_15e4 * 8)) *
                 (*(double *)((long)pvVar5 + (long)(int)local_15e4 * 8) -
                 *(double *)((long)pvVar6 + (long)(int)local_15e4 * 8)) +
                 *(double *)((long)pvVar7 + (long)(int)local_15e4 * 8);
          }
          for (local_15e0 = NaNNUnit::OutputLayer(); -1 < local_15e0; local_15e0 = local_15e0 + -1)
          {
            iVar2 = NaNNUnit::OutputLayer();
            if (iVar2 == local_15e0) {
              (**(code **)(*(long *)local_15a8 + 0x30))(local_15a8,pvVar5,0);
            }
            else {
              (**(code **)(*(long *)local_15a8 + 0x38))(local_15a8,local_15e0,local_15e0 + 1);
            }
          }
          local_15e8 = local_15e8 + 1;
          bVar1 = (**(code **)(*local_28 + 0x20))();
          local_167a = 0;
          if ((bVar1 & 1) != 0) {
            local_167a = (**(code **)(*local_40 + 0x20))();
          }
        } while ((local_167a & 1) != 0);
        for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
          *(double *)((long)pvVar7 + (long)(int)local_15e4 * 8) =
               *(double *)((long)pvVar7 + (long)(int)local_15e4 * 8) / (double)local_15e8;
        }
      }
      bVar1 = (**(code **)(*local_48 + 0x28))();
      if (((bVar1 & 1) != 0) && (bVar1 = (**(code **)(*local_50 + 0x28))(), (bVar1 & 1) != 0)) {
        local_15ec = 0;
        do {
          for (local_15e4 = 0; uVar3 = NaNeuralNetDescr::InputsNumber(local_600), local_15e4 < uVar3
              ; local_15e4 = local_15e4 + 1) {
            dVar9 = (double)(**(code **)(*local_48 + 0x18))(local_48,local_15e4);
            pdVar4[(int)local_15e4] = dVar9;
          }
          for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
            uVar10 = (**(code **)(*local_50 + 0x18))(local_50,local_15e4);
            *(undefined8 *)((long)pvVar5 + (long)(int)local_15e4 * 8) = uVar10;
          }
          NaNNUnit::Function((double *)local_640,pdVar4);
          for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
            *(double *)((long)pvVar8 + (long)(int)local_15e4 * 8) =
                 (*(double *)((long)pvVar5 + (long)(int)local_15e4 * 8) -
                 *(double *)((long)pvVar6 + (long)(int)local_15e4 * 8)) *
                 (*(double *)((long)pvVar5 + (long)(int)local_15e4 * 8) -
                 *(double *)((long)pvVar6 + (long)(int)local_15e4 * 8)) +
                 *(double *)((long)pvVar8 + (long)(int)local_15e4 * 8);
          }
          local_15ec = local_15ec + 1;
          bVar1 = (**(code **)(*local_48 + 0x20))();
          local_169a = 0;
          if ((bVar1 & 1) != 0) {
            local_169a = (**(code **)(*local_50 + 0x20))();
          }
        } while ((local_169a & 1) != 0);
        for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
          *(double *)((long)pvVar8 + (long)(int)local_15e4 * 8) =
               *(double *)((long)pvVar8 + (long)(int)local_15e4 * 8) / (double)local_15ec;
        }
      }
      (**(code **)(*(long *)local_15a8 + 0x28))();
      printf("%d\t",(ulong)local_15dc);
      for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
        printf(" %g",*(undefined8 *)((long)pvVar7 + (long)(int)local_15e4 * 8));
      }
      putchar(9);
      for (local_15e4 = 0; local_15e4 < local_59c; local_15e4 = local_15e4 + 1) {
        printf(" %g",*(undefined8 *)((long)pvVar8 + (long)(int)local_15e4 * 8));
      }
      putchar(10);
      if (local_14 < (int)local_15dc) {
        bTerminate = true;
      }
    }
    if (local_8 < 7) {
      NaNNUnit::Save((char *)local_640);
    }
    else {
      NaNNUnit::Save((char *)local_640);
    }
    NaQuickProp::~NaQuickProp((NaQuickProp *)&local_15a0);
    NaStdBackProp::~NaStdBackProp(local_d60);
    NaNNUnit::~NaNNUnit(local_640);
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc < 4)
    {
      printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("TrainNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  int	nMaxEpochs = -1;	// unlimited
  char	*szMaxEpochs = getenv("MAX_EPOCHS");
  if(NULL != szMaxEpochs) {
      nMaxEpochs = atoi(szMaxEpochs);
  }

  try{
    NaDataFile	*dfLeIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfLeOut = OpenInputDataFile(argv[3]);

    NaDataFile	*dfTeIn = dfLeIn, *dfTeOut = dfLeOut;

    if(argc > 4 && strcmp(argv[4], "-"))
      dfTeIn = OpenInputDataFile(argv[4]);
    if(argc > 5 && strcmp(argv[5], "-"))
      dfTeOut = OpenInputDataFile(argv[5]);

    NaNNUnit            nn;
    nn.Load(argv[1]);

    NaStdBackProp	bpe(nn);
    NaQuickProp		qpe(nn);
    NaStdBackProp	*nnteacher = &bpe;

    char		*szQPropMu = getenv("QPROP_MU");
    if(NULL != szQPropMu) {
	qpe.mu = atof(szQPropMu);
	nnteacher = &qpe;
    }

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nn.descr.InputsNumber()];
    NaReal	*pTar = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pOut = new NaReal[nn.descr.nOutNeurons];

    NaReal	*pLeMSE = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pTeMSE = new NaReal[nn.descr.nOutNeurons];

    /* Let's start the learning */
    int	iEpoch = 0, iLayer, j;

    while(!bTerminate)
      {
	++iEpoch;

	/* Reset error counters */
	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  pLeMSE[j] = pTeMSE[j] = 0.0;

	/* Learning epoch */
	if(dfLeIn->GoStartRecord() && dfLeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfLeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfLeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pLeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      /* Pass through the net in backward direction */
	      for(iLayer = nn.OutputLayer(); iLayer >= 0; --iLayer)
		{
		  if(nn.OutputLayer() == iLayer)
		    /* Output layer */
		    nnteacher->DeltaRule(pTar);
		  else
		    /* Hidden layer */
		    nnteacher->DeltaRule(iLayer, iLayer + 1);
		}

	      ++nSamples;

	    }while(dfLeIn->GoNextRecord() && dfLeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pLeMSE[j] /= nSamples;
	  }

	/* Testing epoch */
	if(dfTeIn->GoStartRecord() && dfTeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfTeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfTeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      ++nSamples;

	    }while(dfTeIn->GoNextRecord() && dfTeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pTeMSE[j] /= nSamples;
	  }

	/* Update the NN weights at the end of each epoch */
	nnteacher->UpdateNN();

	/* Display epoch number, learning and testing errors */
	printf("%d\t", iEpoch);

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pLeMSE[j]);

	putchar('\t');

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pTeMSE[j]);

	putchar('\n');

	if(iEpoch > nMaxEpochs)
	    bTerminate = true;

      }/* End of learning loop */

    if(argc > 6)
      nn.Save(argv[6]);
    else
      nn.Save(argv[1]);
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}